

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O0

EdgeBool * __thiscall
indigox::utils::
Graph<indigox::PermVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>::AddEdge
          (void *param_1,long param_2,param_type param_3,param_type param_4)

{
  EdgeBool e;
  bool *in_stack_ffffffffffffff28;
  edge_desc_impl<boost::undirected_tag,_void_*> *in_stack_ffffffffffffff30;
  param_type in_stack_ffffffffffffff70;
  container_adaptor<_7d36b33f_> *in_stack_ffffffffffffff78;
  adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::PermVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_boost::listS,_boost::setS,_boost::undirectedS,_indigox::PermVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::PermVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_boost::listS,_boost::setS,_boost::undirectedS,_indigox::PermVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>::config>_>
  *in_stack_ffffffffffffffb0;
  undefined6 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbe;
  undefined1 in_stack_ffffffffffffffbf;
  vertex_descriptor in_stack_ffffffffffffffc0;
  void *local_38;
  property_type *local_30;
  bool local_28;
  undefined7 uStack_27;
  
  std::
  __shared_ptr_access<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::PermVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::PermVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)in_stack_ffffffffffffff30);
  boost::
  edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,boost::listS,boost::undirectedS,indigox::PermVertProp,indigox::utils::NoProperty,boost::no_property,boost::listS>,boost::listS,boost::setS,boost::undirectedS,indigox::PermVertProp,indigox::utils::NoProperty,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,boost::listS,boost::undirectedS,indigox::PermVertProp,indigox::utils::NoProperty,boost::no_property,boost::listS>,boost::listS,boost::setS,boost::undirectedS,indigox::PermVertProp,indigox::utils::NoProperty,boost::no_property,boost::listS>::config>>
            (in_stack_ffffffffffffffc0,
             (vertex_descriptor)
             CONCAT17(in_stack_ffffffffffffffbf,
                      CONCAT16(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8)),
             in_stack_ffffffffffffffb0);
  if (param_3 == param_4) {
    std::make_pair<boost::detail::edge_desc_impl<boost::undirected_tag,void*>&,bool>
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  else if ((local_28 & 1U) == 0) {
    std::
    __shared_ptr_access<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::PermVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator*((__shared_ptr_access<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::PermVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)param_4);
    boost::
    add_edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,boost::listS,boost::undirectedS,indigox::PermVertProp,indigox::utils::NoProperty,boost::no_property,boost::listS>,boost::listS,boost::setS,boost::undirectedS,indigox::PermVertProp,indigox::utils::NoProperty,boost::no_property,boost::listS>::config>
              ((vertex_descriptor)e._24_8_,e.first.m_eproperty,
               (edge_property_type *)e.first.super_edge_base<boost::undirected_tag,_void_*>.m_target
               ,(undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::PermVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_boost::listS,_boost::setS,_boost::undirectedS,_indigox::PermVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>::config>
                 *)e.first.super_edge_base<boost::undirected_tag,_void_*>.m_source);
    std::pair<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_bool>::operator=
              ((pair<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_bool> *)
               &stack0xffffffffffffffc0,(type)&stack0xffffffffffffff98);
    *(long *)(param_2 + 0x10) = *(long *)(param_2 + 0x10) + 1;
    boost::bimaps::relation::
    mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_false>
    ::mutant_relation((mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_false>
                       *)param_4,param_3,0x1955ee);
    boost::bimaps::container_adaptor::container_adaptor<$7d36b33f$>::insert
              (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    *(vertex_descriptor *)param_1 = in_stack_ffffffffffffffc0;
    *(void **)((long)param_1 + 8) = local_38;
    *(property_type **)((long)param_1 + 0x10) = local_30;
    *(ulong *)((long)param_1 + 0x18) = CONCAT71(uStack_27,local_28);
  }
  else {
    std::make_pair<boost::detail::edge_desc_impl<boost::undirected_tag,void*>&,bool>
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  return (EdgeBool *)param_1;
}

Assistant:

EdgeBool AddEdge(VertType u, VertType v, EdgeProp p)
      {
        EdgeBool e = boost::edge(u, v, *graph_);
        if (u == v)
          return std::make_pair(e.first, false);
        if (e.second)
          return std::make_pair(e.first, false);
        e = boost::add_edge(u, v, p, *graph_);
        edge_idxmap_.insert({e.first, next_edge_id_++});
        return e;
      }